

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::erase
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,pair<double,_QVariant> *b,
          qsizetype n)

{
  pair<double,_QVariant> *__src;
  pair<double,_QVariant> *ppVar1;
  long in_RDX;
  pair<double,_QVariant> *in_RSI;
  long in_RDI;
  pair<double,_QVariant> *e;
  pair<double,_QVariant> *in_stack_ffffffffffffffa8;
  pair<double,_QVariant> *in_stack_ffffffffffffffb0;
  
  __src = in_RSI + in_RDX;
  std::destroy<std::pair<double,QVariant>*>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ppVar1 = QArrayDataPointer<std::pair<double,_QVariant>_>::begin
                     ((QArrayDataPointer<std::pair<double,_QVariant>_> *)0x696787);
  if ((in_RSI == ppVar1) &&
     (ppVar1 = QArrayDataPointer<std::pair<double,_QVariant>_>::end
                         ((QArrayDataPointer<std::pair<double,_QVariant>_> *)
                          in_stack_ffffffffffffffb0), __src != ppVar1)) {
    *(pair<double,_QVariant> **)(in_RDI + 8) = __src;
  }
  else {
    ppVar1 = QArrayDataPointer<std::pair<double,_QVariant>_>::end
                       ((QArrayDataPointer<std::pair<double,_QVariant>_> *)in_stack_ffffffffffffffb0
                       );
    if (__src != ppVar1) {
      ppVar1 = QArrayDataPointer<std::pair<double,_QVariant>_>::end
                         ((QArrayDataPointer<std::pair<double,_QVariant>_> *)in_RSI);
      memmove(in_RSI,__src,(((long)ppVar1 - (long)__src) / 0x28) * 0x28);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }